

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int fwdata_device_version(char *device_path)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  igsc_device_handle handle;
  igsc_fwdata_version2 fwdata_version;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  handle.ctx = (igsc_lib_ctx *)0x0;
  iVar2 = igsc_device_init_by_device(&handle,device_path);
  if (iVar2 == 0) {
    fwdata_version.flags = 0;
    fwdata_version.data_arb_svn = 0;
    fwdata_version.data_arb_svn_fitb = 0;
    fwdata_version.format_version = 0;
    fwdata_version.oem_manuf_data_version = 0;
    fwdata_version.oem_manuf_data_version_fitb = 0;
    fwdata_version.major_version = 0;
    fwdata_version.major_vcn = 0;
    iVar3 = 3;
    do {
      iVar2 = igsc_device_fwdata_version2(&handle,&fwdata_version);
      if (iVar2 != 0xd) {
        if (iVar2 == 0) {
          print_dev_fwdata_version(&fwdata_version);
          goto LAB_0010a003;
        }
        if (iVar2 == 0xc) {
          if (quiet == '\0') {
            fprintf(_stderr,
                    "Error: Permission denied: missing required credentials to access the device %s\n"
                    ,device_path);
          }
          goto LAB_0010a003;
        }
        break;
      }
      usleep(2000000);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    if (quiet == '\0') {
      fprintf(_stderr,"Error: Failed to get fwdata version from device: %s\n",device_path);
    }
    print_device_fw_status(&handle);
LAB_0010a003:
    igsc_device_close(&handle);
  }
  else if (quiet == '\0') {
    fprintf(_stderr,"Error: Failed to initialize device: %s\n",device_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

mockable_static
int fwdata_device_version(const char *device_path)
{
    struct igsc_fwdata_version2 fwdata_version;
    struct igsc_device_handle handle;
    int ret;
    unsigned int retries = 0;

    memset(&handle, 0, sizeof(handle));
    ret = igsc_device_init_by_device(&handle, device_path);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to initialize device: %s\n", device_path);
        return ret;
    }

    memset(&fwdata_version, 0, sizeof(fwdata_version));
    while ((ret = igsc_device_fwdata_version2(&handle, &fwdata_version)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret != IGSC_SUCCESS)
    {
        if (ret == IGSC_ERROR_PERMISSION_DENIED)
        {
            fwupd_error("Permission denied: missing required credentials to access the device %s\n", device_path);
        }
        else
        {
            fwupd_error("Failed to get fwdata version from device: %s\n", device_path);
            print_device_fw_status(&handle);
        }
        goto exit;
    }

    print_dev_fwdata_version(&fwdata_version);

exit:
    (void)igsc_device_close(&handle);
    return ret;
}